

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctx.c
# Opt level: O1

_Bool chirc_ctx_get_or_create_channel(chirc_ctx_t *ctx,char *channelname,chirc_channel_t **channel)

{
  UT_hash_bucket *pUVar1;
  UT_hash_handle *pUVar2;
  chirc_channel_t *pcVar3;
  UT_hash_handle *pUVar4;
  UT_hash_handle *pUVar5;
  undefined1 uVar6;
  int iVar7;
  size_t sVar8;
  byte *pbVar9;
  chirc_channel_t *pcVar10;
  sds pcVar11;
  UT_hash_table *pUVar12;
  UT_hash_bucket *pUVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  chirc_channel_t *pcVar21;
  
  sVar8 = strlen(channelname);
  *channel = (chirc_channel_t *)0x0;
  if (ctx->channels != (chirc_channel_t *)0x0) {
    uVar20 = (uint)sVar8;
    pbVar9 = (byte *)channelname;
    if (uVar20 < 0xc) {
      uVar15 = 0xfeedbeef;
      uVar17 = 0x9e3779b9;
      uVar16 = 0x9e3779b9;
      uVar18 = uVar20;
    }
    else {
      uVar16 = 0x9e3779b9;
      uVar15 = 0xfeedbeef;
      uVar17 = 0x9e3779b9;
      uVar14 = sVar8 & 0xffffffff;
      do {
        uVar15 = uVar15 + *(int *)(pbVar9 + 8);
        uVar18 = uVar15 >> 0xd ^
                 ((uVar16 + *(int *)pbVar9) - (uVar17 + *(int *)(pbVar9 + 4))) - uVar15;
        uVar17 = uVar18 << 8 ^ ((uVar17 + *(int *)(pbVar9 + 4)) - uVar15) - uVar18;
        uVar16 = uVar17 >> 0xd ^ (uVar15 - uVar18) - uVar17;
        uVar18 = uVar16 >> 0xc ^ (uVar18 - uVar17) - uVar16;
        uVar15 = uVar18 << 0x10 ^ (uVar17 - uVar16) - uVar18;
        uVar19 = uVar15 >> 5 ^ (uVar16 - uVar18) - uVar15;
        uVar16 = uVar19 >> 3 ^ (uVar18 - uVar15) - uVar19;
        uVar17 = uVar16 << 10 ^ (uVar15 - uVar19) - uVar16;
        uVar15 = uVar17 >> 0xf ^ (uVar19 - uVar16) - uVar17;
        pbVar9 = pbVar9 + 0xc;
        uVar18 = (int)uVar14 - 0xc;
        uVar14 = (ulong)uVar18;
      } while (0xb < uVar18);
    }
    uVar15 = uVar15 + uVar20;
    switch(uVar18) {
    case 0xb:
      uVar15 = (uint)pbVar9[10] * 0x1000000 + uVar15;
    case 10:
      uVar15 = (uint)pbVar9[9] * 0x10000 + uVar15;
    case 9:
      uVar15 = (uint)pbVar9[8] * 0x100 + uVar15;
    case 8:
      uVar17 = (uint)pbVar9[7] * 0x1000000 + uVar17;
    case 7:
      uVar17 = (uint)pbVar9[6] * 0x10000 + uVar17;
    case 6:
      uVar17 = (uint)pbVar9[5] * 0x100 + uVar17;
    case 5:
      uVar17 = pbVar9[4] + uVar17;
    case 4:
      uVar16 = (uint)pbVar9[3] * 0x1000000 + uVar16;
    case 3:
      uVar16 = (uint)pbVar9[2] * 0x10000 + uVar16;
    case 2:
      uVar16 = (uint)pbVar9[1] * 0x100 + uVar16;
    case 1:
      uVar16 = *pbVar9 + uVar16;
    }
    *channel = (chirc_channel_t *)0x0;
    if (ctx->channels != (chirc_channel_t *)0x0) {
      uVar18 = uVar15 >> 0xd ^ (uVar16 - uVar17) - uVar15;
      uVar17 = uVar18 << 8 ^ (uVar17 - uVar15) - uVar18;
      uVar16 = uVar17 >> 0xd ^ (uVar15 - uVar18) - uVar17;
      uVar18 = uVar16 >> 0xc ^ (uVar18 - uVar17) - uVar16;
      uVar17 = uVar18 << 0x10 ^ (uVar17 - uVar16) - uVar18;
      uVar15 = uVar17 >> 5 ^ (uVar16 - uVar18) - uVar17;
      uVar18 = uVar15 >> 3 ^ (uVar18 - uVar17) - uVar15;
      uVar16 = uVar18 << 10 ^ (uVar17 - uVar15) - uVar18;
      uVar18 = uVar16 >> 0xf ^ uVar15 - (uVar18 + uVar16);
      pUVar12 = (ctx->channels->hh).tbl;
      pUVar2 = pUVar12->buckets[pUVar12->num_buckets - 1 & uVar18].hh_head;
      if (pUVar2 == (UT_hash_handle *)0x0) {
        pcVar21 = (chirc_channel_t *)0x0;
      }
      else {
        pcVar21 = (chirc_channel_t *)((long)pUVar2 - pUVar12->hho);
      }
      *channel = pcVar21;
      if (pcVar21 != (chirc_channel_t *)0x0) {
        do {
          if ((((pcVar21->hh).hashv == uVar18) && ((pcVar21->hh).keylen == uVar20)) &&
             (iVar7 = bcmp((pcVar21->hh).key,channelname,sVar8 & 0xffffffff), iVar7 == 0)) break;
          pUVar2 = (pcVar21->hh).hh_next;
          if (pUVar2 == (UT_hash_handle *)0x0) {
            pcVar21 = (chirc_channel_t *)0x0;
          }
          else {
            pcVar21 = (chirc_channel_t *)((long)pUVar2 - ((ctx->channels->hh).tbl)->hho);
          }
          *channel = pcVar21;
        } while (pcVar21 != (chirc_channel_t *)0x0);
      }
    }
  }
  pcVar21 = *channel;
  if (pcVar21 == (chirc_channel_t *)0x0) {
    pcVar10 = (chirc_channel_t *)malloc(0x60);
    *channel = pcVar10;
    chirc_channel_init(pcVar10);
    pcVar11 = sdsnew(channelname);
    (*channel)->name = pcVar11;
    pcVar10 = *channel;
    pcVar11 = pcVar10->name;
    uVar20 = (byte)pcVar11[-1] & 7;
    if (uVar20 < 5) {
      uVar6 = (*(code *)(&DAT_0010a170 + *(int *)(&DAT_0010a170 + (ulong)uVar20 * 4)))();
      return (_Bool)uVar6;
    }
    switch(uVar20) {
    case 0:
      uVar20 = (uint)((byte)pcVar11[-1] >> 3);
      break;
    case 1:
      uVar20 = (uint)(byte)pcVar11[-3];
      break;
    case 2:
      uVar20 = (uint)*(ushort *)(pcVar11 + -5);
      break;
    case 3:
      uVar20 = *(uint *)(pcVar11 + -9);
      break;
    case 4:
      uVar20 = (uint)*(undefined8 *)(pcVar11 + -0x11);
      break;
    default:
      uVar20 = 0;
    }
    uVar20 = uVar20 + 0xfeedbeef;
    uVar18 = uVar20 >> 0xd ^ -uVar20;
    uVar15 = uVar18 << 8 ^ (-0x61c88647 - uVar20) - uVar18;
    uVar16 = uVar15 >> 0xd ^ (uVar20 - uVar18) - uVar15;
    uVar18 = uVar16 >> 0xc ^ (uVar18 - uVar15) - uVar16;
    uVar20 = uVar18 << 0x10 ^ (uVar15 - uVar16) - uVar18;
    uVar16 = uVar20 >> 5 ^ (uVar16 - uVar18) - uVar20;
    uVar18 = uVar16 >> 3 ^ (uVar18 - uVar20) - uVar16;
    uVar20 = uVar18 << 10 ^ (uVar20 - uVar16) - uVar18;
    uVar20 = uVar20 >> 0xf ^ uVar16 - (uVar18 + uVar20);
    (pcVar10->hh).hashv = uVar20;
    (pcVar10->hh).key = pcVar11;
    pcVar10 = *channel;
    pcVar11 = pcVar10->name;
    switch(pcVar11[-1] & 7) {
    case 0:
      uVar18 = (uint)((byte)pcVar11[-1] >> 3);
      break;
    case 1:
      uVar18 = (uint)(byte)pcVar11[-3];
      break;
    case 2:
      uVar18 = (uint)*(ushort *)(pcVar11 + -5);
      break;
    case 3:
      uVar18 = *(uint *)(pcVar11 + -9);
      break;
    case 4:
      uVar18 = (uint)*(undefined8 *)(pcVar11 + -0x11);
      break;
    default:
      uVar18 = 0;
    }
    (pcVar10->hh).keylen = uVar18;
    pcVar3 = ctx->channels;
    if (pcVar3 == (chirc_channel_t *)0x0) {
      (pcVar10->hh).next = (void *)0x0;
      ((*channel)->hh).prev = (void *)0x0;
      pUVar12 = (UT_hash_table *)malloc(0x40);
      ((*channel)->hh).tbl = pUVar12;
      pUVar12 = ((*channel)->hh).tbl;
      if (pUVar12 == (UT_hash_table *)0x0) goto LAB_001049ac;
      pUVar12->ineff_expands = 0;
      pUVar12->noexpand = 0;
      *(undefined8 *)&pUVar12->signature = 0;
      pUVar12->hho = 0;
      pUVar12->ideal_chain_maxlen = 0;
      pUVar12->nonideal_items = 0;
      *(undefined8 *)&pUVar12->num_items = 0;
      pUVar12->tail = (UT_hash_handle *)0x0;
      pUVar12->buckets = (UT_hash_bucket *)0x0;
      pUVar12->num_buckets = 0;
      pUVar12->log2_num_buckets = 0;
      (((*channel)->hh).tbl)->tail = &(*channel)->hh;
      pUVar12 = ((*channel)->hh).tbl;
      pUVar12->num_buckets = 0x20;
      pUVar12->log2_num_buckets = 5;
      pUVar12->hho = 0x28;
      pUVar13 = (UT_hash_bucket *)malloc(0x200);
      pUVar12->buckets = pUVar13;
      pUVar12 = ((*channel)->hh).tbl;
      pUVar12->signature = 0xa0111fe1;
      pUVar13 = pUVar12->buckets;
      if (pUVar13 == (UT_hash_bucket *)0x0) goto LAB_001049ac;
      memset(pUVar13,0,0x200);
      ctx->channels = *channel;
    }
    else {
      (pcVar10->hh).tbl = (pcVar3->hh).tbl;
      ((*channel)->hh).next = (void *)0x0;
      pUVar12 = (pcVar3->hh).tbl;
      pUVar2 = pUVar12->tail;
      ((*channel)->hh).prev = (void *)((long)pUVar2 - pUVar12->hho);
      pUVar2->next = *channel;
      pUVar12->tail = &(*channel)->hh;
    }
    pUVar12 = (ctx->channels->hh).tbl;
    pUVar12->num_items = pUVar12->num_items + 1;
    uVar20 = pUVar12->num_buckets - 1 & uVar20;
    pUVar13 = pUVar12->buckets;
    uVar18 = pUVar13[uVar20].count + 1;
    pUVar13[uVar20].count = uVar18;
    pUVar2 = pUVar13[uVar20].hh_head;
    ((*channel)->hh).hh_next = pUVar2;
    ((*channel)->hh).hh_prev = (UT_hash_handle *)0x0;
    if (pUVar2 != (UT_hash_handle *)0x0) {
      pUVar2->hh_prev = &(*channel)->hh;
    }
    pUVar13[uVar20].hh_head = &(*channel)->hh;
    if (pUVar13[uVar20].expand_mult * 10 + 10 <= uVar18) {
      pcVar10 = *channel;
      pUVar12 = (pcVar10->hh).tbl;
      if (pUVar12->noexpand == 0) {
        sVar8 = (ulong)pUVar12->num_buckets << 5;
        pUVar13 = (UT_hash_bucket *)malloc(sVar8);
        if (pUVar13 == (UT_hash_bucket *)0x0) {
LAB_001049ac:
          exit(-1);
        }
        uVar20 = 0;
        memset(pUVar13,0,sVar8);
        pUVar12 = (pcVar10->hh).tbl;
        pUVar12->ideal_chain_maxlen =
             ((pUVar12->num_items >> ((char)pUVar12->log2_num_buckets + 1U & 0x1f)) + 1) -
             (uint)((pUVar12->num_buckets * 2 - 1 & pUVar12->num_items) == 0);
        pUVar12->nonideal_items = 0;
        pUVar12 = ((*channel)->hh).tbl;
        if (pUVar12->num_buckets != 0) {
          uVar14 = 0;
          do {
            pUVar2 = pUVar12->buckets[uVar14].hh_head;
            while (pUVar2 != (UT_hash_handle *)0x0) {
              pUVar12 = ((*channel)->hh).tbl;
              uVar16 = pUVar12->num_buckets * 2 - 1 & pUVar2->hashv;
              pUVar4 = pUVar2->hh_next;
              pUVar1 = pUVar13 + uVar16;
              uVar18 = pUVar13[uVar16].count + 1;
              pUVar13[uVar16].count = uVar18;
              if (pUVar12->ideal_chain_maxlen < uVar18) {
                pUVar12->nonideal_items = pUVar12->nonideal_items + 1;
                if (pUVar12->ideal_chain_maxlen * pUVar1->expand_mult < uVar18) {
                  pUVar1->expand_mult = pUVar1->expand_mult + 1;
                }
              }
              pUVar2->hh_prev = (UT_hash_handle *)0x0;
              pUVar5 = pUVar1->hh_head;
              pUVar2->hh_next = pUVar5;
              if (pUVar5 != (UT_hash_handle *)0x0) {
                pUVar5->hh_prev = pUVar2;
              }
              pUVar1->hh_head = pUVar2;
              pUVar2 = pUVar4;
            }
            uVar14 = uVar14 + 1;
            pUVar12 = ((*channel)->hh).tbl;
          } while (uVar14 < pUVar12->num_buckets);
        }
        free(pUVar12->buckets);
        pUVar12 = ((*channel)->hh).tbl;
        pUVar12->num_buckets = pUVar12->num_buckets << 1;
        pUVar12->log2_num_buckets = pUVar12->log2_num_buckets + 1;
        pUVar12->buckets = pUVar13;
        pUVar12 = ((*channel)->hh).tbl;
        if (pUVar12->num_items >> 1 < pUVar12->nonideal_items) {
          uVar20 = pUVar12->ineff_expands + 1;
        }
        pUVar12->ineff_expands = uVar20;
        if (1 < uVar20) {
          pUVar12->noexpand = 1;
        }
      }
    }
  }
  return pcVar21 == (chirc_channel_t *)0x0;
}

Assistant:

bool chirc_ctx_get_or_create_channel(chirc_ctx_t *ctx, char *channelname, chirc_channel_t **channel)
{
    bool created;


    HASH_FIND_STR(ctx->channels, channelname, *channel);
    if(*channel)
    {
        created = false;
    }
    else
    {
        created = true;

        *channel = malloc(sizeof(chirc_channel_t));
        chirc_channel_init(*channel);
        (*channel)->name = sdsnew(channelname);
        HASH_ADD_KEYPTR(hh, ctx->channels, (*channel)->name, sdslen((*channel)->name), *channel);
    }

    return created;
}